

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int evthread_notify_base_eventfd(event_base *base)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  bool bVar4;
  undefined8 uStack_18;
  int r;
  uint64_t msg;
  event_base *base_local;
  
  uStack_18 = 1;
  msg = (uint64_t)base;
  do {
    sVar2 = write(*(int *)(msg + 500),&stack0xffffffffffffffe8,8);
    bVar4 = false;
    if ((int)sVar2 < 0) {
      piVar3 = __errno_location();
      bVar4 = *piVar3 == 0xb;
    }
  } while (bVar4);
  iVar1 = 0;
  if ((int)sVar2 < 0) {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int
evthread_notify_base_eventfd(struct event_base *base)
{
	ev_uint64_t msg = 1;
	int r;
	do {
		r = write(base->th_notify_fd[0], (void*) &msg, sizeof(msg));
	} while (r < 0 && errno == EAGAIN);

	return (r < 0) ? -1 : 0;
}